

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
::internal_clear(btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                 *this,node_type *node)

{
  btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  *node_00;
  _Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
  *alloc;
  ulong i;
  
  if (((ulong)node & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  if (node[0xb] != (node_type)0x0) {
    delete_leaf_node(this,node);
    return;
  }
  i = 0xffffffffffffffff;
  do {
    i = i + 1;
    node_00 = btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
              ::child(node,i);
    internal_clear(this,node_00);
  } while (i < (byte)node[10]);
  alloc = &(this->root_).
           super__Tuple_impl<0UL,_phmap::priv::StringBtreeDefaultLess,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_*>
           .
           super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_*>
           .
           super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
  ;
  btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  ::destroy(node,&alloc->_M_head_impl);
  Deallocate<8ul,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            (&alloc->_M_head_impl,node,0xf0);
  return;
}

Assistant:

void btree<P>::internal_clear(node_type *node) {
        if (!node->leaf()) {
            for (int i = 0; i <= node->count(); ++i) {
                internal_clear(node->child(i));
            }
            delete_internal_node(node);
        } else {
            delete_leaf_node(node);
        }
    }